

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# availableprofiles.c
# Opt level: O0

int check_available(void)

{
  char *pcVar1;
  long lVar2;
  int size;
  uint uVar3;
  char **ppcVar4;
  undefined8 uStackY_40;
  char *apcStack_28 [2];
  int local_18;
  int local_14;
  int i;
  int total;
  char **avail;
  
  _i = (char **)0x0;
  uStackY_40 = 0x1084f8;
  size = MOJOSHADER_glAvailableProfiles
                   (lookup,(void *)0x0,(char **)0x0,0,(MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                    (void *)0x0);
  ppcVar4 = apcStack_28;
  local_14 = size;
  if (0 < size) {
    lVar2 = -((long)size * 8 + 0xfU & 0xfffffffffffffff0);
    _i = (char **)((long)apcStack_28 + lVar2);
    *(undefined8 *)(&stack0xffffffffffffffc8 + lVar2) = 0;
    *(undefined8 *)((long)&uStackY_40 + lVar2) = 0x10854c;
    local_14 = MOJOSHADER_glAvailableProfiles
                         (lookup,(void *)0x0,(char **)((long)apcStack_28 + lVar2),size,
                          (MOJOSHADER_malloc)0x0,(MOJOSHADER_free)0x0,
                          *(void **)(&stack0xffffffffffffffc8 + lVar2));
    ppcVar4 = (char **)((long)apcStack_28 + lVar2);
  }
  if (local_14 < 1) {
    *(undefined8 *)((long)ppcVar4 + -8) = 0x108571;
    fprintf(_stderr,"No profiles available.\n");
  }
  else {
    for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
      apcStack_28[1] = _i[local_18];
      pcVar1 = _i[local_18];
      *(undefined8 *)((long)ppcVar4 + -8) = 0x1085a3;
      uVar3 = MOJOSHADER_maxShaderModel(pcVar1);
      pcVar1 = apcStack_28[1];
      *(undefined8 *)((long)ppcVar4 + -8) = 0x1085b7;
      printf("%s (Shader Model %d)\n",pcVar1,(ulong)uVar3);
    }
  }
  return 0;
}

Assistant:

static int check_available(void)
{
    const char **avail = NULL;
    int total = MOJOSHADER_glAvailableProfiles(lookup, NULL, NULL, 0, NULL, NULL, NULL);
    if (total > 0)
    {
        avail = (const char **) alloca(sizeof (const char *) * total);
        total = MOJOSHADER_glAvailableProfiles(lookup, NULL, avail, total, NULL, NULL, NULL);
    } // if

    if (total <= 0)
        fprintf(stderr, "No profiles available.\n");
    else
    {
        int i;
        for (i = 0; i < total; i++)
        {
            printf("%s (Shader Model %d)\n", avail[i],
                   MOJOSHADER_maxShaderModel(avail[i]));
        } // for
    } // else

    return 0;
}